

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O0

void prsxgen_pia(prscxdef *ctx)

{
  errcxdef *ctx_00;
  long in_RDI;
  prsndef *exprnode;
  prsndef *in_stack_00000028;
  prscxdef *in_stack_00000030;
  char *in_stack_ffffffffffffffe8;
  prscxdef *in_stack_fffffffffffffff0;
  
  ctx_00 = (errcxdef *)prsexpr(in_stack_fffffffffffffff0);
  if ((((*(uint *)(*(long *)(in_RDI + 8) + 0x11c) & 4) != 0) && (ctx_00 != (errcxdef *)0x0)) &&
     (*(int *)&ctx_00->errcxptr == 0x9e)) {
    errlogf(ctx_00,in_stack_ffffffffffffffe8,0);
  }
  prsgexp(in_stack_00000030,in_stack_00000028);
  *(undefined8 *)(in_RDI + 0x90) = *(undefined8 *)(in_RDI + 0xa8);
  *(undefined2 *)(in_RDI + 0xa0) = *(undefined2 *)(in_RDI + 0xb0);
  return;
}

Assistant:

void prsxgen_pia(prscxdef *ctx)
{
    prsndef *exprnode;

    /* parse the expression */
    exprnode = prsexpr(ctx);

    /* check for a possibly incorrect assignment if in C mode */
    if ((ctx->prscxtok->tokcxflg & TOKCXFCMODE)
        && exprnode && exprnode->prsntyp == TOKTASSIGN)
        errlog(ctx->prscxerr, ERR_PIA);

    /* generate the expression, and reset the parse node pool */
    prsgexp(ctx, exprnode);
    prsrstn(ctx);
}